

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O1

bool __thiscall common::SettingsSpan::last_negated(SettingsSpan *this)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = this->size;
  if (sVar2 != 0) {
    if (this->data[sVar2 - 1].typ == VBOOL) {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&this->data[sVar2 - 1].val,"1");
      bVar4 = iVar3 != 0;
      goto LAB_00d4d943;
    }
  }
  bVar4 = false;
LAB_00d4d943:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool SettingsSpan::last_negated() const { return size > 0 && data[size - 1].isFalse(); }